

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_linux_epoll.c
# Opt level: O0

int epoll_ctl_mod_fail(int epfd,int op,int fd,epoll_event *event)

{
  int *piVar1;
  epoll_event *event_local;
  int fd_local;
  int op_local;
  int epfd_local;
  
  if (op == 3) {
    piVar1 = __errno_location();
    *piVar1 = 0x1c;
    op_local = -1;
  }
  else {
    op_local = 0;
  }
  return op_local;
}

Assistant:

static int epoll_ctl_mod_fail(int epfd, int op, int fd, struct epoll_event *event)
{

	(void)epfd;
	(void)fd;
	(void)event;

	if (op == EPOLL_CTL_MOD) {
		errno = ENOSPC;
		return -1;
	} else {
		return 0;
	}
}